

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_sharded.hpp
# Opt level: O3

shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::metric_pair>
__thiscall
ylt::util::internal::
map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::value_type>_>_>_>
::find(map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_>
       *this,key_type *key)

{
  size_type *psVar1;
  pthread_mutex_t *__mutex;
  unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>
  *puVar2;
  int iVar3;
  iterator iVar4;
  undefined8 uVar5;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::metric_pair>
  sVar6;
  
  __mutex = (pthread_mutex_t *)key->_M_ptr;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    uVar5 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock(__mutex);
    _Unwind_Resume(uVar5);
  }
  if ((_Hashtable<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>,_std::__detail::_Select1st,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)key[1]._M_ptr !=
      (_Hashtable<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>,_std::__detail::_Select1st,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    iVar4 = std::
            _Hashtable<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::value_type>,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::value_type>_>,_std::__detail::_Select1st,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_equal,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_hash<131UL>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>,_std::__detail::_Select1st,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)key[1]._M_ptr,in_RDX);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>,_false>
        ._M_cur != (__node_type *)0x0) {
      (this->mtx_)._M_t.super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
      super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
      super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl =
           *(mutex **)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>,_false>
                   ._M_cur + 0x10);
      puVar2 = *(unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>
                 **)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>,_false>
                           ._M_cur + 0x18);
      (this->map_)._M_t.
      super___uniq_ptr_impl<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>,_std::default_delete<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_*,_std::default_delete<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_>_>
      .
      super__Head_base<0UL,_std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_*,_false>
      ._M_head_impl = puVar2;
      if (puVar2 != (unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>
                     *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &(puVar2->_M_h)._M_bucket_count;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &(puVar2->_M_h)._M_bucket_count;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
      goto LAB_0018cca7;
    }
  }
  (this->mtx_)._M_t.super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
  super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl = (mutex *)0x0;
  (this->map_)._M_t.
  super___uniq_ptr_impl<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>,_std::default_delete<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_*,_std::default_delete<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>_*,_false>
  ._M_head_impl =
       (unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>
        *)0x0;
LAB_0018cca7:
  pthread_mutex_unlock(__mutex);
  sVar6.
  super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.
  super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::metric_pair>
          )sVar6.
           super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<typename mapped_type::element_type> find(
      const key_type& key) const {
    std::lock_guard lock(*mtx_);
    if (!map_) [[unlikely]] {
      return nullptr;
    }
    auto it = map_->find(key);
    if (it == map_->end()) {
      return nullptr;
    }
    return it->second;
  }